

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluGLContextFactory.cpp
# Opt level: O0

void __thiscall eglu::anon_unknown_1::RenderContext::postIterate(RenderContext *this)

{
  int iVar1;
  deUint32 err;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int stencilBits;
  int numSamples;
  undefined4 extraout_var;
  ResourceError *pRVar5;
  PixelFormat *format;
  Enum<int,_2UL> EVar6;
  bool local_1f1;
  RenderTarget local_1e8;
  uint local_1c4;
  uint local_1c0;
  int newHeight;
  int newWidth;
  int local_1b0;
  GetNameFunc local_1a8;
  int local_1a0;
  string local_198;
  allocator<char> local_171;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150 [3];
  exception *e;
  WindowSurfacePair windowSurface;
  WindowDestroyedError *anon_var_0;
  GetNameFunc local_b0;
  int local_a8;
  string local_a0;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  bool local_21;
  int local_20;
  int iStack_1c;
  bool badWindow;
  EGLint error;
  EGLBoolean swapOk;
  Library *egl;
  RenderContext *this_local;
  
  egl = (Library *)this;
  iVar1 = (*this->m_display->_vptr_NativeDisplay[2])();
  _error = (long *)CONCAT44(extraout_var,iVar1);
  if (this->m_window == (NativeWindow *)0x0) {
    (*(this->m_glFunctions).flush)();
  }
  else {
    iStack_1c = (**(code **)(*_error + 0x188))(_error,this->m_eglDisplay,this->m_eglSurface);
    local_20 = (**(code **)(*_error + 0xf8))();
    local_1f1 = local_20 == 0x300d || local_20 == 0x300b;
    local_21 = local_1f1;
    if ((iStack_1c == 0) && (local_20 != 0x300d && local_20 != 0x300b)) {
      pRVar5 = (ResourceError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"eglSwapBuffers() failed: ",&local_69);
      EVar6 = getErrorStr(local_20);
      local_b0 = EVar6.m_getName;
      local_a8 = EVar6.m_value;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_a0,&local_b0);
      std::operator+(&local_48,&local_68,&local_a0);
      tcu::ResourceError::ResourceError(pRVar5,&local_48);
      __cxa_throw(pRVar5,&tcu::ResourceError::typeinfo,tcu::ResourceError::~ResourceError);
    }
    (*this->m_window->_vptr_NativeWindow[4])();
    if (iStack_1c == 0) {
      newHeight._3_1_ = 1;
      pRVar5 = (ResourceError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_170,"eglSwapBuffers() failed: ",&local_171);
      EVar6 = getErrorStr(local_20);
      _newWidth = EVar6.m_getName;
      local_1b0 = EVar6.m_value;
      local_1a8 = _newWidth;
      local_1a0 = local_1b0;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_198,&local_1a8);
      std::operator+(local_150,&local_170,&local_198);
      tcu::ResourceError::ResourceError(pRVar5,local_150);
      newHeight._3_1_ = 0;
      __cxa_throw(pRVar5,&tcu::ResourceError::typeinfo,tcu::ResourceError::~ResourceError);
    }
    local_1c0 = 0;
    local_1c4 = 0;
    (**(code **)(*_error + 0x158))(_error,this->m_eglDisplay,this->m_eglSurface,0x3057,&local_1c0);
    (**(code **)(*_error + 0x158))(_error,this->m_eglDisplay,this->m_eglSurface,0x3056,&local_1c4);
    err = (**(code **)(*_error + 0xf8))();
    checkError(err,"Failed to query window size",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLContextFactory.cpp"
               ,0x232);
    uVar3 = local_1c0;
    uVar2 = tcu::RenderTarget::getWidth(&this->m_glRenderTarget);
    uVar4 = local_1c4;
    if ((uVar3 != uVar2) ||
       (uVar3 = tcu::RenderTarget::getHeight(&this->m_glRenderTarget), uVar4 != uVar3)) {
      uVar4 = tcu::RenderTarget::getWidth(&this->m_glRenderTarget);
      uVar3 = tcu::RenderTarget::getHeight(&this->m_glRenderTarget);
      tcu::print("Warning: Window size changed (%dx%d -> %dx%d), test results might be invalid!\n",
                 (ulong)uVar4,(ulong)uVar3,(ulong)local_1c0,(ulong)local_1c4);
      uVar3 = local_1c0;
      uVar4 = local_1c4;
      format = tcu::RenderTarget::getPixelFormat(&this->m_glRenderTarget);
      iVar1 = tcu::RenderTarget::getDepthBits(&this->m_glRenderTarget);
      stencilBits = tcu::RenderTarget::getStencilBits(&this->m_glRenderTarget);
      numSamples = tcu::RenderTarget::getNumSamples(&this->m_glRenderTarget);
      tcu::RenderTarget::RenderTarget(&local_1e8,uVar3,uVar4,format,iVar1,stencilBits,numSamples);
      memcpy(&this->m_glRenderTarget,&local_1e8,0x24);
      tcu::RenderTarget::~RenderTarget(&local_1e8);
    }
  }
  return;
}

Assistant:

void RenderContext::postIterate (void)
{
	const Library& egl = m_display->getLibrary();

	if (m_window)
	{
		EGLBoolean	swapOk		= egl.swapBuffers(m_eglDisplay, m_eglSurface);
		EGLint		error		= egl.getError();
		const bool	badWindow	= error == EGL_BAD_SURFACE || error == EGL_BAD_NATIVE_WINDOW;

		if (!swapOk && !badWindow)
			throw tcu::ResourceError(string("eglSwapBuffers() failed: ") + getErrorStr(error).toString());

		try
		{
			m_window->processEvents();
		}
		catch (const WindowDestroyedError&)
		{
			tcu::print("Warning: Window destroyed, recreating...\n");

			EGLU_CHECK_CALL(egl, makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
			EGLU_CHECK_CALL(egl, destroySurface(m_eglDisplay, m_eglSurface));
			m_eglSurface = EGL_NO_SURFACE;

			delete m_window;
			m_window = DE_NULL;

			try
			{
				WindowSurfacePair windowSurface = createWindow(m_display, m_nativeWindowFactory, m_eglDisplay, m_eglConfig, m_renderConfig);
				m_window		= windowSurface.first;
				m_eglSurface	= windowSurface.second;

				EGLU_CHECK_CALL(egl, makeCurrent(m_eglDisplay, m_eglSurface, m_eglSurface, m_eglContext));

				swapOk	= EGL_TRUE;
				error	= EGL_SUCCESS;
			}
			catch (const std::exception& e)
			{
				if (m_eglSurface)
				{
					egl.makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT);
					egl.destroySurface(m_eglDisplay, m_eglSurface);
					m_eglSurface = EGL_NO_SURFACE;
				}

				delete m_window;
				m_window = DE_NULL;

				throw tcu::ResourceError(string("Failed to re-create window: ") + e.what());
			}
		}

		if (!swapOk)
		{
			DE_ASSERT(badWindow);
			throw tcu::ResourceError(string("eglSwapBuffers() failed: ") + getErrorStr(error).toString());
		}

		// Refresh dimensions
		{
			int	newWidth	= 0;
			int	newHeight	= 0;

			egl.querySurface(m_eglDisplay, m_eglSurface, EGL_WIDTH,		&newWidth);
			egl.querySurface(m_eglDisplay, m_eglSurface, EGL_HEIGHT,	&newHeight);
			EGLU_CHECK_MSG(egl, "Failed to query window size");

			if (newWidth	!= m_glRenderTarget.getWidth() ||
				newHeight	!= m_glRenderTarget.getHeight())
			{
				tcu::print("Warning: Window size changed (%dx%d -> %dx%d), test results might be invalid!\n",
						   m_glRenderTarget.getWidth(), m_glRenderTarget.getHeight(), newWidth, newHeight);

				m_glRenderTarget = tcu::RenderTarget(newWidth, newHeight,
													 m_glRenderTarget.getPixelFormat(),
													 m_glRenderTarget.getDepthBits(),
													 m_glRenderTarget.getStencilBits(),
													 m_glRenderTarget.getNumSamples());
			}
		}
	}
	else
		m_glFunctions.flush();
}